

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O0

void __thiscall btSoftBody::appendLinearJoint(btSoftBody *this,Specs *specs,btSoftBody *body)

{
  Cluster **ppCVar1;
  long in_RDX;
  long in_RDI;
  Cluster *in_stack_00000080;
  Specs *in_stack_00000088;
  btSoftBody *in_stack_00000090;
  undefined1 in_stack_000000a0 [24];
  Body local_30;
  long local_18;
  
  local_18 = in_RDX;
  btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
            ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),0);
  ppCVar1 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                      ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(local_18 + 0x5d8),0);
  Body::Body(&local_30,*ppCVar1);
  appendLinearJoint(in_stack_00000090,in_stack_00000088,in_stack_00000080,(Body)in_stack_000000a0);
  return;
}

Assistant:

void			btSoftBody::appendLinearJoint(const LJoint::Specs& specs,btSoftBody* body)
{
	appendLinearJoint(specs,m_clusters[0],body->m_clusters[0]);
}